

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
* __thiscall
spirv_cross::Compiler::get_active_interface_variables
          (unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
           *__return_storage_ptr__,Compiler *this)

{
  uint32_t id;
  SPIRFunction *func;
  TypedID<(spirv_cross::Types)2> local_54;
  anon_class_8_1_10ae0417 local_50 [3];
  undefined1 local_38 [8];
  InterfaceVariableAccessHandler handler;
  Compiler *this_local;
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  *variables;
  
  handler.variables._7_1_ = 0;
  ::std::
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  ::unordered_set(__return_storage_ptr__);
  InterfaceVariableAccessHandler::InterfaceVariableAccessHandler
            ((InterfaceVariableAccessHandler *)local_38,this,__return_storage_ptr__);
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  func = get<spirv_cross::SPIRFunction>(this,id);
  traverse_all_reachable_opcodes(this,func,(OpcodeHandler *)local_38);
  local_50[0].variables = __return_storage_ptr__;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::Compiler::get_active_interface_variables()const::__0>
            (&this->ir,local_50);
  if (this->dummy_sampler_id != 0) {
    TypedID<(spirv_cross::Types)2>::TypedID(&local_54,this->dummy_sampler_id);
    ::std::
    unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
    ::insert(__return_storage_ptr__,&local_54);
  }
  handler.variables._7_1_ = 1;
  InterfaceVariableAccessHandler::~InterfaceVariableAccessHandler
            ((InterfaceVariableAccessHandler *)local_38);
  if ((handler.variables._7_1_ & 1) == 0) {
    ::std::
    unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
    ::~unordered_set(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

unordered_set<VariableID> Compiler::get_active_interface_variables() const
{
	// Traverse the call graph and find all interface variables which are in use.
	unordered_set<VariableID> variables;
	InterfaceVariableAccessHandler handler(*this, variables);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	// Make sure we preserve output variables which are only initialized, but never accessed by any code.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (var.storage == StorageClassOutput && var.initializer != ID(0))
			variables.insert(var.self);
	});

	// If we needed to create one, we'll need it.
	if (dummy_sampler_id)
		variables.insert(dummy_sampler_id);

	return variables;
}